

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerMixin.cpp
# Opt level: O2

TimerId __thiscall Liby::TimerMixin::runHelper(TimerMixin *this,TimerHolder *timerHolder)

{
  Timer *pTVar1;
  __shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2> *this_00;
  TimerId id;
  uint64_t local_20;
  
  pTVar1 = TimerHolder::getTimer(timerHolder);
  local_20 = pTVar1->id_;
  this_00 = (__shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2> *)
            std::__detail::
            _Map_base<unsigned_long,_std::pair<const_unsigned_long,_Liby::TimerHolder>,_std::allocator<std::pair<const_unsigned_long,_Liby::TimerHolder>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_Liby::TimerHolder>,_std::allocator<std::pair<const_unsigned_long,_Liby::TimerHolder>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->timerHolders_,&local_20);
  std::__shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>::operator=
            (this_00,(__shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2> *)timerHolder);
  return local_20;
}

Assistant:

TimerId TimerMixin::runHelper(TimerHolder &&timerHolder) {
    TimerId id = timerHolder.getTimer().id();
    timerHolders_[id] = timerHolder;
    return id;
}